

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzelchdiv.cpp
# Opt level: O0

void __thiscall
TPZCompElHDiv<pzshape::TPZShapeCube>::TPZCompElHDiv
          (TPZCompElHDiv<pzshape::TPZShapeCube> *this,TPZCompMesh *mesh,TPZGeoEl *gel,
          HDivFamily hdivfam)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  int64_t iVar6;
  int *piVar7;
  long *plVar8;
  TPZConnect *this_00;
  TPZVec<int> *ord_00;
  HDivFamily in_ECX;
  TPZGeoEl *in_RDX;
  TPZCompMesh *in_RSI;
  TPZCompElHDiv<pzshape::TPZShapeCube> *in_RDI;
  TPZManVector<int,_3> ord;
  int order_1;
  TPZMatSingleSpace *mat;
  int side;
  int firstside;
  TPZManVector<int,_3> order;
  int sideorder;
  int sideaux;
  int i;
  TPZStack<int,_10> facesides;
  int nconflux;
  int in_stack_fffffffffffffe1c;
  undefined4 in_stack_fffffffffffffe20;
  int in_stack_fffffffffffffe24;
  TPZCompEl *in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe30;
  int in_stack_fffffffffffffe34;
  TPZGeoEl *in_stack_fffffffffffffe38;
  TPZCompMesh *in_stack_fffffffffffffe40;
  void **in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe50;
  int in_stack_fffffffffffffe54;
  int local_e0;
  TPZGeoEl *in_stack_ffffffffffffff68;
  
  TPZRegisterClassId::TPZRegisterClassId<TPZCompElHDiv<pzshape::TPZShapeCube>>
            ((TPZRegisterClassId *)in_RDI,0x21);
  TPZSavable::TPZSavable((TPZSavable *)in_RDI,&PTR_PTR_024bd130);
  TPZIntelGen<pzshape::TPZShapeCube>::TPZIntelGen
            ((TPZIntelGen<pzshape::TPZShapeCube> *)
             CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),in_stack_fffffffffffffe48
             ,in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,in_stack_fffffffffffffe34);
  *(undefined ***)
   &(in_RDI->super_TPZIntelGen<pzshape::TPZShapeCube>).super_TPZInterpolatedElement.
    super_TPZInterpolationSpace.super_TPZCompEl = &PTR__TPZCompElHDiv_024bcd10;
  *(undefined ***)
   &(in_RDI->super_TPZIntelGen<pzshape::TPZShapeCube>).super_TPZInterpolatedElement.
    super_TPZInterpolationSpace.super_TPZCompEl = &PTR__TPZCompElHDiv_024bcd10;
  TPZManVector<int,_6>::TPZManVector
            ((TPZManVector<int,_6> *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
             (int64_t)in_stack_fffffffffffffe48,(int *)in_stack_fffffffffffffe40);
  std::__cxx11::list<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_>::list
            ((list<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_> *)0x1a1ac94);
  TPZManVector<long,_7>::TPZManVector
            ((TPZManVector<long,_7> *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
             (int64_t)in_stack_fffffffffffffe48,(long *)in_stack_fffffffffffffe40);
  in_RDI->fhdivfam = in_ECX;
  iVar1 = TPZCompMesh::GetDefaultOrder(in_RSI);
  (in_RDI->super_TPZIntelGen<pzshape::TPZShapeCube>).super_TPZInterpolatedElement.
  super_TPZInterpolationSpace.fPreferredOrder = iVar1;
  NConnects(in_RDI);
  TPZManVector<long,_7>::Resize
            ((TPZManVector<long,_7> *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
             (int64_t)in_stack_fffffffffffffe48);
  TPZGeoEl::SetReference(in_RDX,(TPZCompEl *)in_RDI);
  TPZStack<int,_10>::TPZStack
            ((TPZStack<int,_10> *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
  pztopology::TPZCube::LowerDimensionSides
            (in_stack_fffffffffffffe34,(TPZStack<int,_10> *)in_stack_fffffffffffffe28,
             in_stack_fffffffffffffe24);
  TPZStack<int,_10>::Push
            ((TPZStack<int,_10> *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
             in_stack_fffffffffffffe1c);
  for (iVar1 = 0; lVar5 = (long)iVar1,
      iVar6 = TPZVec<int>::size((TPZVec<int> *)&stack0xffffffffffffff68), lVar5 < iVar6;
      iVar1 = iVar1 + 1) {
    piVar7 = TPZVec<int>::operator[]((TPZVec<int> *)&stack0xffffffffffffff68,(long)iVar1);
    iVar2 = *piVar7;
    lVar5 = (**(code **)(*(long *)&(in_RDI->super_TPZIntelGen<pzshape::TPZShapeCube>).
                                   super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                   super_TPZCompEl + 0x370))(in_RDI,iVar2);
    plVar8 = TPZVec<long>::operator[](&(in_RDI->fConnectIndexes).super_TPZVec<long>,(long)iVar1);
    *plVar8 = lVar5;
    TPZCompMesh::ConnectVec(in_RSI);
    TPZVec<long>::operator[](&(in_RDI->fConnectIndexes).super_TPZVec<long>,(long)iVar1);
    this_00 = TPZChunkVector<TPZConnect,_10>::operator[]
                        ((TPZChunkVector<TPZConnect,_10> *)in_stack_fffffffffffffe40,
                         (int64_t)in_stack_fffffffffffffe38);
    TPZConnect::IncrementElConnected(this_00);
    (**(code **)(*(long *)&(in_RDI->super_TPZIntelGen<pzshape::TPZShapeCube>).
                           super_TPZInterpolatedElement.super_TPZInterpolationSpace.super_TPZCompEl
                + 0x378))(in_RDI,iVar2);
  }
  iVar2 = (**(code **)(*(long *)&(in_RDI->super_TPZIntelGen<pzshape::TPZShapeCube>).
                                 super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                 super_TPZCompEl + 0x338))(in_RDI,0x1a);
  iVar3 = TPZIntCube3D::GetMaxOrder(&(in_RDI->super_TPZIntelGen<pzshape::TPZShapeCube>).fIntRule);
  if (iVar3 < (iVar2 + 1) * 2) {
    TPZIntCube3D::GetMaxOrder(&(in_RDI->super_TPZIntelGen<pzshape::TPZShapeCube>).fIntRule);
  }
  TPZManVector<int,_3>::TPZManVector
            ((TPZManVector<int,_3> *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
             (int64_t)in_stack_fffffffffffffe48,(int *)in_stack_fffffffffffffe40);
  TPZIntCube3D::SetOrder
            ((TPZIntCube3D *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
             (TPZVec<int> *)in_stack_fffffffffffffe28,in_stack_fffffffffffffe24);
  for (local_e0 = 0x14; local_e0 < 0x1a; local_e0 = local_e0 + 1) {
    TPZCompEl::Reference(in_stack_fffffffffffffe28);
    in_stack_fffffffffffffe54 = TPZGeoEl::NormalOrientation(in_stack_ffffffffffffff68,iVar1);
    in_stack_fffffffffffffe48 =
         (void **)TPZVec<int>::operator[]
                            (&(in_RDI->fSideOrient).super_TPZVec<int>,(long)(local_e0 + -0x14));
    *(int *)in_stack_fffffffffffffe48 = in_stack_fffffffffffffe54;
  }
  piVar7 = (int *)(**(code **)(*(long *)&(in_RDI->super_TPZIntelGen<pzshape::TPZShapeCube>).
                                         super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                         super_TPZCompEl + 0xb8))();
  if (piVar7 == (int *)0x0) {
    ord_00 = (TPZVec<int> *)0x0;
  }
  else {
    ord_00 = (TPZVec<int> *)
             __dynamic_cast(piVar7,&TPZMaterial::typeinfo,&TPZMatSingleSpace::typeinfo,
                            0xfffffffffffffffe);
  }
  if (ord_00 != (TPZVec<int> *)0x0) {
    uVar4 = (**(code **)(*(long *)&(in_RDI->super_TPZIntelGen<pzshape::TPZShapeCube>).
                                   super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                   super_TPZCompEl + 0x268))();
    in_stack_fffffffffffffe24 = (*ord_00->_vptr_TPZVec[0xb])(ord_00,(ulong)uVar4);
    in_stack_fffffffffffffe20 = (**(code **)(*(long *)in_RDX + 0x210))();
    TPZManVector<int,_3>::TPZManVector
              ((TPZManVector<int,_3> *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50)
               ,(int64_t)in_stack_fffffffffffffe48,piVar7);
    TPZIntCube3D::SetOrder
              ((TPZIntCube3D *)CONCAT44(uVar4,in_stack_fffffffffffffe30),ord_00,
               in_stack_fffffffffffffe24);
    TPZManVector<int,_3>::~TPZManVector
              ((TPZManVector<int,_3> *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20)
              );
  }
  TPZManVector<int,_3>::~TPZManVector
            ((TPZManVector<int,_3> *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
  TPZStack<int,_10>::~TPZStack((TPZStack<int,_10> *)0x1a1b26d);
  return;
}

Assistant:

TPZCompElHDiv<TSHAPE>::TPZCompElHDiv(TPZCompMesh &mesh, TPZGeoEl *gel, const HDivFamily hdivfam) :
TPZRegisterClassId(&TPZCompElHDiv::ClassId),
TPZIntelGen<TSHAPE>(mesh,gel,1), fSideOrient(TSHAPE::NFacets,1), fhdivfam(hdivfam) {
	this->TPZInterpolationSpace::fPreferredOrder = mesh.GetDefaultOrder();
	int nconflux= TPZCompElHDiv::NConnects();
    this->fConnectIndexes.Resize(nconflux);
	gel->SetReference(this);

//    int nfaces = TSHAPE::NumSides(TSHAPE::Dimension-1);
    TPZStack<int> facesides;
    TSHAPE::LowerDimensionSides(TSHAPE::NSides-1,facesides,TSHAPE::Dimension-1);
    facesides.Push(TSHAPE::NSides-1);
	for(int i=0;i< facesides.size(); i++)
	{
        int sideaux= facesides[i];
		this->fConnectIndexes[i] = this->CreateMidSideConnect(sideaux);
#ifdef PZ_LOG
        if (logger.isDebugEnabled())
        {
            std::stringstream sout;
            sout << "After creating last flux connect " << i << std::endl;
            //	this->Print(sout);
            LOGPZ_DEBUG(logger,sout.str())
        }
#endif

		mesh.ConnectVec()[this->fConnectIndexes[i]].IncrementElConnected();
		this->IdentifySideOrder(sideaux);
    }


    int sideorder = EffectiveSideOrder(TSHAPE::NSides-1);
//    if(TSHAPE::Type()==EQuadrilateral)
//    {
//        sideorder++;
//    }

    sideorder++;

	sideorder = 2*sideorder;
	if (sideorder > this->fIntRule.GetMaxOrder()) sideorder = this->fIntRule.GetMaxOrder();
	TPZManVector<int,3> order(3,sideorder);
	this->fIntRule.SetOrder(order);
    int firstside = TSHAPE::NSides-TSHAPE::NFacets-1;
    for(int side = firstside ; side < TSHAPE::NSides-1; side++ )
    {
        fSideOrient[side-firstside] = this->Reference()->NormalOrientation(side);
    }
    auto *mat =
        dynamic_cast<TPZMatSingleSpace *>(this->Material());
    if (mat)
    {
        int order = mat->IntegrationRuleOrder(MaxOrder());
        TPZManVector<int,3> ord(gel->Dimension(),order);
        this->fIntRule.SetOrder(ord);
    }

    if (fhdivfam == HDivFamily::EHDivConstant) {
        // For HDiv constant, polynomial order was compatibilized in connectorders, 
        // see TPZShapeHDivConstant<TSHAPE>::Initialize. So now we need to update
        // the number of shape functions and also the integration rule
        if (TSHAPE::Type() == ETriangle || TSHAPE::Type() == EQuadrilateral || TSHAPE::Type() == ETetraedro){
            for (int icon = 0; icon < this->NConnects(); icon++)
            {
                TPZConnect &c = this->Connect(icon);
                int nShapeF = NConnectShapeF(icon,c.Order());
                if (c.NShape() != nShapeF){
                    DebugStop();
                }
            }
        }
    }
}